

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O1

int asn1_get_sequence_of_cb(void *ctx,int tag,uchar *start,size_t len)

{
  int *piVar1;
  int *piVar2;
  
  piVar1 = *(int **)((long)ctx + 8);
  piVar2 = piVar1;
  if (*(long *)(piVar1 + 4) != 0) {
    piVar2 = (int *)calloc(1,0x20);
    *(int **)(piVar1 + 6) = piVar2;
    if (piVar2 == (int *)0x0) {
      return -0x6a;
    }
  }
  *(uchar **)(piVar2 + 4) = start;
  *(size_t *)(piVar2 + 2) = len;
  *piVar2 = tag;
  *(int **)((long)ctx + 8) = piVar2;
  return 0;
}

Assistant:

static int asn1_get_sequence_of_cb(void *ctx,
                                   int tag,
                                   unsigned char *start,
                                   size_t len)
{
    asn1_get_sequence_of_cb_ctx_t *cb_ctx =
        (asn1_get_sequence_of_cb_ctx_t *) ctx;
    mbedtls_asn1_sequence *cur =
        cb_ctx->cur;

    if (cur->buf.p != NULL) {
        cur->next = (struct mbedtls_asn1_sequence *)
            mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

        if (cur->next == NULL) {
            return MBEDTLS_ERR_ASN1_ALLOC_FAILED;
        }

        cur = cur->next;
    }

    cur->buf.p = start;
    cur->buf.len = len;
    cur->buf.tag = tag;

    cb_ctx->cur = cur;
    return 0;
}